

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

error_code llvm::sys::fs::is_symlink_file(Twine *path,bool *result)

{
  error_category *peVar1;
  error_code eVar2;
  file_status local_58;
  
  local_58.super_basic_file_status.fs_st_size._0_4_ = 0;
  local_58.super_basic_file_status._36_8_ = 0;
  local_58.super_basic_file_status.fs_st_atime_nsec = 0;
  local_58.super_basic_file_status.fs_st_mtime_nsec = 0;
  local_58.super_basic_file_status.fs_st_uid = 0;
  local_58.super_basic_file_status.fs_st_gid = 0;
  local_58.super_basic_file_status.fs_st_atime = 0;
  local_58.super_basic_file_status.fs_st_mtime = 0;
  eVar2 = status(path,&local_58,false);
  peVar1 = eVar2._M_cat;
  if (eVar2._M_value == 0) {
    *result = local_58.super_basic_file_status.Type == symlink_file;
    peVar1 = (error_category *)std::_V2::system_category();
  }
  eVar2._4_4_ = 0;
  eVar2._M_cat = peVar1;
  return eVar2;
}

Assistant:

std::error_code is_symlink_file(const Twine &path, bool &result) {
  file_status st;
  if (std::error_code ec = status(path, st, false))
    return ec;
  result = is_symlink_file(st);
  return std::error_code();
}